

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O1

void Assimp::ExportSceneSTL
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  _Alloc_hider _Var1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  runtime_error *prVar5;
  STLExporter exporter;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [376];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined4 extraout_var;
  
  iVar2 = ExportProperties::GetPropertyInteger(pProperties,"EXPORT_POINT_CLOUDS",0);
  STLExporter::STLExporter((STLExporter *)local_1e0,pFile,pScene,iVar2 != 0,false);
  if ((local_1e0[*(long *)(local_1e0._0_8_ + -0x18) + 0x20] & 5) != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pFile,&local_221);
    std::operator+(&local_220,"output data creation failed. Most likely the file became too large: "
                   ,&local_200);
    std::runtime_error::runtime_error(prVar5,(string *)&local_220);
    *(undefined ***)prVar5 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    _Var1._M_p = local_220._M_dataplus._M_p;
    uVar4 = std::ostream::tellp();
    (**(code **)(*plVar3 + 0x18))(plVar3,_Var1._M_p,uVar4,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pFile,&local_221);
  std::operator+(&local_220,"could not open output .stl file: ",&local_200);
  std::runtime_error::runtime_error(prVar5,(string *)&local_220);
  *(undefined ***)prVar5 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneSTL(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties )
{
    bool exportPointClouds = pProperties->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);

    // invoke the exporter
    STLExporter exporter(pFile, pScene, exportPointClouds );

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stl file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}